

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_dump_children(lws *wsi)

{
  int iVar1;
  lws_log_cx *cx;
  char *pcVar2;
  char *local_30;
  lws **local_18;
  lws **w;
  lws *wsi_local;
  
  if (((wsi->mux).parent_wsi != (lws *)0x0) && (iVar1 = lwsl_visible(8), iVar1 != 0)) {
    for (local_18 = &(((wsi->mux).parent_wsi)->mux).child_list; *local_18 != (lws *)0x0;
        local_18 = &((*local_18)->mux).sibling_list) {
      cx = lwsl_wsi_get_cx(wsi);
      if ((*local_18)->role_ops == (lws_role_ops *)0x0) {
        local_30 = "?";
      }
      else {
        local_30 = (*local_18)->role_ops->name;
      }
      pcVar2 = lws_wsi_tag(*local_18);
      _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_wsi_mux_dump_children","   \\---- child %s %s\n"
                  ,local_30,pcVar2);
      if (*local_18 == ((*local_18)->mux).sibling_list) {
        __assert_fail("*w != (*w)->mux.sibling_list",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                      ,0x56c,"void lws_wsi_mux_dump_children(struct lws *)");
      }
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_children(struct lws *wsi)
{
#if defined(_DEBUG)
	if (!wsi->mux.parent_wsi || !lwsl_visible(LLL_INFO))
		return;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {
		lwsl_wsi_info(wsi, "   \\---- child %s %s\n",
				   (*w)->role_ops ? (*w)->role_ops->name : "?",
							   lws_wsi_tag(*w));
		assert(*w != (*w)->mux.sibling_list);
	} lws_end_foreach_llp(w, mux.sibling_list);
#endif
}